

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::fillTexture
          (FunctionalTest12 *this,texture *texture,GLuint *color)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_data,0x400);
  puVar1 = texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 3;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 0x10) {
      *(GLuint *)((long)puVar1 + lVar3 + -0xc) = *color;
      *(GLuint *)((long)puVar1 + lVar3 + -8) = color[1];
      *(GLuint *)((long)puVar1 + lVar3 + -4) = color[2];
      *(GLuint *)((long)puVar1 + lVar3) = color[3];
    }
    puVar1 = puVar1 + 0x40;
  }
  Utils::texture::update
            (texture,0x10,0x10,0x8d99,0x1405,
             texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void FunctionalTest12::fillTexture(Utils::texture& texture, const glw::GLuint color[4]) const
{
	std::vector<GLuint> texture_data;

	/* Prepare texture data */
	texture_data.resize(m_texture_width * m_texture_height * 4);

	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset = x * 4 + line_offset;

			texture_data[point_offset + 0] = color[0]; /* red */
			texture_data[point_offset + 1] = color[1]; /* green */
			texture_data[point_offset + 2] = color[2]; /* blue */
			texture_data[point_offset + 3] = color[3]; /* alpha */
		}
	}

	texture.update(m_texture_width, m_texture_height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &texture_data[0]);
}